

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  int iVar2;
  double dVar3;
  
  Args::operator=(&this->bestArgs_,args);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  iVar2 = (int)((ulong)((long)_Var1._M_current -
                       (long)(this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (_Var1._M_current ==
      (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar2 = 0;
  }
  this->bestMinnIndex_ = iVar2;
  dVar3 = log2(((double)CONCAT44(0x45300000,(int)(args->dsub >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)args->dsub) - 4503599627370496.0));
  this->bestDsubExponent_ = (int)dVar3;
  if (args->bucket != 0) {
    this->bestNonzeroBucket_ = args->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}